

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

int64_t try_restoration_unit
                  (RestSearchCtxt *rsc,RestorationTileLimits *limits,RestorationUnitInfo *rui)

{
  byte bVar1;
  int iVar2;
  AV1_COMMON *pAVar3;
  SequenceHeader *pSVar4;
  int64_t iVar5;
  uint ss_x;
  long lVar6;
  uint ss_y;
  long lVar7;
  RestorationLineBuffers rlbs;
  
  pAVar3 = rsc->cm;
  iVar2 = rsc->plane;
  lVar7 = (long)iVar2;
  ss_y = 0;
  pSVar4 = pAVar3->seq_params;
  bVar1 = pSVar4->use_highbitdepth;
  ss_x = 0;
  if (0 < lVar7) {
    ss_x = (uint)(pSVar4->subsampling_x != 0);
  }
  if (0 < iVar2) {
    ss_y = (uint)(pSVar4->subsampling_y != 0);
  }
  lVar6 = (ulong)(0 < iVar2) * 4;
  av1_loop_restoration_filter_unit
            (limits,rui,&pAVar3->rst_info[lVar7].boundaries,&rlbs,rsc->plane_w,rsc->plane_h,ss_x,
             ss_y,(uint)bVar1,pSVar4->bit_depth,(pAVar3->cur_frame->buf).store_buf_adr[lVar7 + -4],
             *(int *)((long)(pAVar3->cur_frame->buf).store_buf_adr + lVar6 + -0x28),
             rsc->dst->store_buf_adr[lVar7 + -4],
             *(int *)((long)rsc->dst->store_buf_adr + lVar6 + -0x28),pAVar3->rst_tmpbuf,0,
             pAVar3->error);
  iVar5 = (*sse_part_extractors[(ulong)bVar1 * 3 + lVar7])
                    (rsc->src,rsc->dst,limits->h_start,limits->h_end - limits->h_start,
                     limits->v_start,limits->v_end - limits->v_start);
  return iVar5;
}

Assistant:

static int64_t try_restoration_unit(const RestSearchCtxt *rsc,
                                    const RestorationTileLimits *limits,
                                    const RestorationUnitInfo *rui) {
  const AV1_COMMON *const cm = rsc->cm;
  const int plane = rsc->plane;
  const int is_uv = plane > 0;
  const RestorationInfo *rsi = &cm->rst_info[plane];
  RestorationLineBuffers rlbs;
  const int bit_depth = cm->seq_params->bit_depth;
  const int highbd = cm->seq_params->use_highbitdepth;

  const YV12_BUFFER_CONFIG *fts = &cm->cur_frame->buf;
  // TODO(yunqing): For now, only use optimized LR filter in decoder. Can be
  // also used in encoder.
  const int optimized_lr = 0;

  av1_loop_restoration_filter_unit(
      limits, rui, &rsi->boundaries, &rlbs, rsc->plane_w, rsc->plane_h,
      is_uv && cm->seq_params->subsampling_x,
      is_uv && cm->seq_params->subsampling_y, highbd, bit_depth,
      fts->buffers[plane], fts->strides[is_uv], rsc->dst->buffers[plane],
      rsc->dst->strides[is_uv], cm->rst_tmpbuf, optimized_lr, cm->error);

  return sse_restoration_unit(limits, rsc->src, rsc->dst, plane, highbd);
}